

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O2

void __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
::Initialize(Node<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
             *this,pair<unsigned_long,_duckdb::timestamp_t> *value)

{
  pointer pNVar1;
  result_type rVar2;
  
  (this->_value).first = value->first;
  (this->_value).second.value = (value->second).value;
  (this->_nodeRefs)._swapLevel = 0;
  pNVar1 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_nodeRefs)._nodes.
      super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar1) {
    (this->_nodeRefs)._nodes.
    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar1;
  }
  do {
    SwappableNodeRefStack<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>
    ::push_back(&this->_nodeRefs,this,
                (ulong)((this->_nodeRefs)._nodes.
                        super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                       (this->_nodeRefs)._nodes.
                       super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::timestamp_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::timestamp_t>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start));
    rVar2 = pcg_detail::
            engine<unsigned_int,_unsigned_long,_pcg_detail::xsh_rs_mixin<unsigned_int,_unsigned_long>,_true,_pcg_detail::no_stream<unsigned_long>,_pcg_detail::default_multiplier<unsigned_long>_>
            ::operator()(&this->_pool->prng);
  } while (rVar2 < 0x7fffffff);
  return;
}

Assistant:

void Initialize(const T &value) {
		_value = value;
		_nodeRefs.clear();
		do {
			_nodeRefs.push_back(this, _nodeRefs.height() ? 0 : 1);
		} while (_pool.prng() < _pool.prng.max() / 2);
	}